

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O0

void __thiscall
cmCTestBZR::StatusParser::DoPath(StatusParser *this,char c0,char c1,char c2,string *path)

{
  ulong uVar1;
  string *path_local;
  char c2_local;
  char c1_local;
  char c0_local;
  StatusParser *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    cmsys::SystemTools::ConvertToUnixSlashes(path);
    if (c0 == 'C') {
      (*(this->BZR->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[10])(this->BZR,2,path);
    }
    else if (((((c0 == '+') || (c0 == 'R')) || (c0 == 'P')) || ((c1 == 'M' || (c1 == 'K')))) ||
            ((c1 == 'N' || ((c1 == 'D' || (c2 == '*')))))) {
      (*(this->BZR->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[10])(this->BZR,1,path);
    }
  }
  return;
}

Assistant:

void DoPath(char c0, char c1, char c2, std::string path)
  {
    if (path.empty()) {
      return;
    }
    cmSystemTools::ConvertToUnixSlashes(path);

    if (c0 == 'C') {
      this->BZR->DoModification(PathConflicting, path);
      return;
    }

    if (c0 == '+' || c0 == 'R' || c0 == 'P' || c1 == 'M' || c1 == 'K' ||
        c1 == 'N' || c1 == 'D' || c2 == '*') {
      this->BZR->DoModification(PathModified, path);
      return;
    }
  }